

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O2

mraa_board_t * mraa_intel_edison_fab_c(void)

{
  uint pin;
  int iVar1;
  mraa_boolean_t mVar2;
  mraa_result_t mVar3;
  mraa_board_t *b;
  mraa_adv_func_t *__ptr;
  mraa_pininfo_t *pmVar4;
  mraa_gpio_context dev;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  int release;
  int major;
  mraa_gpio_dir_t tristate_dir;
  int minor;
  utsname name;
  
  b = (mraa_board_t *)calloc(1,0x5f0);
  if (b == (mraa_board_t *)0x0) {
    return (mraa_board_t *)0x0;
  }
  b->platform_name = "Intel Edison";
  iVar1 = uname((utsname *)&name);
  if (iVar1 == 0) {
    iVar1 = __isoc99_sscanf(name.release,"%d.%d.%d",&major,&minor,&release);
    if (iVar1 == 2) {
      release = 0;
    }
    else if (iVar1 < 2) goto LAB_00117b49;
    if (3 < major) {
      vanilla_kernel = '\x01';
      syslog(5,"edison: Linux version 4 or higher detected, assuming Vanilla kernel");
    }
    mVar2 = is_arduino_board();
    if (mVar2 == 0) {
      syslog(5,"edison: Arduino board not detected, assuming Intel Edison Miniboard");
      mVar3 = mraa_intel_edison_miniboard(b);
      if (mVar3 == MRAA_SUCCESS) {
        return b;
      }
    }
    else {
      b->phy_pin_count = 0x14;
      b->gpio_count = 0xe;
      b->aio_count = 6;
      b->platform_version = "arduino";
      __ptr = (mraa_adv_func_t *)calloc(1,0x288);
      b->adv_func = __ptr;
      if (__ptr != (mraa_adv_func_t *)0x0) {
        __ptr->gpio_dir_pre = mraa_intel_edison_gpio_dir_pre;
        __ptr->gpio_init_post = mraa_intel_edison_gpio_init_post;
        __ptr->gpio_close_pre = mraa_intel_edison_gpio_close_pre;
        __ptr->gpio_dir_post = mraa_intel_edison_gpio_dir_post;
        __ptr->i2c_init_pre = mraa_intel_edison_i2c_init_pre;
        __ptr->i2c_set_frequency_replace = mraa_intel_edison_i2c_freq;
        __ptr->aio_get_valid_fp = mraa_intel_edison_aio_get_fp;
        __ptr->aio_init_pre = mraa_intel_edison_aio_init_pre;
        __ptr->aio_init_post = mraa_intel_edison_aio_init_post;
        __ptr->pwm_init_pre = mraa_intel_edison_pwm_init_pre;
        __ptr->pwm_init_post = mraa_intel_edison_pwm_init_post;
        __ptr->pwm_enable_pre = mraa_intel_edison_pwm_enable_pre;
        __ptr->pwm_write_pre = mraa_intel_edison_pwm_write_pre;
        __ptr->spi_init_pre = mraa_intel_edison_spi_init_pre;
        __ptr->spi_init_post = mraa_intel_edison_spi_init_post;
        __ptr->gpio_mode_replace = mraa_intel_edison_gpio_mode_replace;
        __ptr->uart_init_pre = mraa_intel_edison_uart_init_pre;
        __ptr->uart_init_post = mraa_intel_edison_uart_init_post;
        __ptr->gpio_mmap_setup = mraa_intel_edison_mmap_setup;
        __ptr->spi_lsbmode_replace = mraa_intel_edison_spi_lsbmode_replace;
        pmVar4 = (mraa_pininfo_t *)calloc(0x19,0x2f4);
        b->pins = pmVar4;
        if (pmVar4 != (mraa_pininfo_t *)0x0) {
          mVar3 = mraa_gpio_read_dir(tristate,&tristate_dir);
          if (mVar3 == MRAA_SUCCESS) {
            if (tristate_dir != MRAA_GPIO_OUT) {
              mraa_gpio_dir(tristate,MRAA_GPIO_OUT);
            }
            mVar3 = mraa_gpio_write(tristate,0);
            if (mVar3 == MRAA_SUCCESS) {
              lVar5 = 0;
              do {
                if (lVar5 == 0x18) {
                  mVar3 = mraa_intel_edison_pinmode_change(0x73,1);
                  if (((mVar3 == MRAA_SUCCESS) &&
                      (mVar3 = mraa_intel_edison_pinmode_change(0x72,1), mVar3 == MRAA_SUCCESS)) &&
                     (mVar3 = mraa_intel_edison_pinmode_change(0x6d,1), mVar3 == MRAA_SUCCESS)) {
                    mraa_gpio_write(tristate,1);
                  }
                  break;
                }
                pin = *(uint *)((long)&mraa_intel_edison_misc_spi_gpio_pin_list + lVar5);
                dev = mraa_gpio_init_raw(pin);
                if (dev == (mraa_gpio_context)0x0) {
                  syslog(3,"edison: Failed to init raw gpio %d!",(ulong)pin);
                  break;
                }
                bVar7 = false;
                mVar3 = mraa_gpio_dir(dev,MRAA_GPIO_OUT);
                if (mVar3 == MRAA_SUCCESS) {
                  mVar3 = mraa_gpio_write(dev,*(int *)((long)&
                                                  mraa_intel_edison_misc_spi_gpio_val_list + lVar5))
                  ;
                  bVar7 = mVar3 == MRAA_SUCCESS;
                }
                mraa_gpio_close(dev);
                lVar5 = lVar5 + 4;
              } while (bVar7);
            }
            b->adc_raw = 0xc;
            b->adc_supported = 10;
            b->pwm_default_period = 5000;
            b->pwm_max_period = 0x35555;
            b->pwm_min_period = 1;
            pmVar4 = b->pins;
            builtin_strncpy(pmVar4->name,"IO0",4);
            pmVar4->name[4] = '\0';
            pmVar4->name[5] = '\0';
            pmVar4->name[6] = '\0';
            pmVar4->name[7] = '\0';
            *(undefined1 *)&b->pins->capabilities = 0x83;
            pmVar4 = b->pins;
            (pmVar4->gpio).pinmap = 0x82;
            (pmVar4->gpio).parent_id = 0;
            (pmVar4->gpio).mux_total = 1;
            (pmVar4->gpio).mux[0].pincmd = 2;
            (pmVar4->gpio).mux[0].pin = 0xd8;
            (pmVar4->gpio).mux[0].value = 1;
            (pmVar4->uart).pinmap = 0;
            (pmVar4->uart).parent_id = 0;
            (pmVar4->uart).mux_total = 0;
            pmVar4[1].name[0] = 'I';
            pmVar4[1].name[1] = 'O';
            pmVar4[1].name[2] = '1';
            pmVar4[1].name[3] = '\0';
            pmVar4[1].name[4] = '\0';
            pmVar4[1].name[5] = '\0';
            pmVar4[1].name[6] = '\0';
            pmVar4[1].name[7] = '\0';
            *(undefined1 *)&b->pins[1].capabilities = 0x83;
            pmVar4 = b->pins;
            pmVar4[1].gpio.pinmap = 0x83;
            pmVar4[1].gpio.parent_id = 0;
            pmVar4[1].gpio.mux_total = 1;
            pmVar4[1].gpio.mux[0].pincmd = 2;
            pmVar4[1].gpio.mux[0].pin = 0xd9;
            pmVar4[1].gpio.mux[0].value = 1;
            pmVar4[1].uart.pinmap = 0;
            pmVar4[1].uart.parent_id = 0;
            pmVar4[1].uart.mux_total = 0;
            pmVar4[2].name[0] = 'I';
            pmVar4[2].name[1] = 'O';
            pmVar4[2].name[2] = '2';
            pmVar4[2].name[3] = '\0';
            pmVar4[2].name[4] = '\0';
            pmVar4[2].name[5] = '\0';
            pmVar4[2].name[6] = '\0';
            pmVar4[2].name[7] = '\0';
            *(undefined1 *)&b->pins[2].capabilities = 3;
            pmVar4 = b->pins;
            pmVar4[2].gpio.pinmap = 0x80;
            pmVar4[2].gpio.parent_id = 0;
            pmVar4[2].gpio.mux_total = 1;
            pmVar4[2].gpio.mux[0].pincmd = 2;
            pmVar4[2].gpio.mux[0].pin = 0xda;
            pmVar4[2].gpio.mux[0].value = 1;
            pmVar4[3].name[0] = 'I';
            pmVar4[3].name[1] = 'O';
            pmVar4[3].name[2] = '3';
            pmVar4[3].name[3] = '\0';
            pmVar4[3].name[4] = '\0';
            pmVar4[3].name[5] = '\0';
            pmVar4[3].name[6] = '\0';
            pmVar4[3].name[7] = '\0';
            *(undefined1 *)&b->pins[3].capabilities = 7;
            pmVar4 = b->pins;
            pmVar4[3].gpio.pinmap = 0xc;
            pmVar4[3].gpio.parent_id = 0;
            pmVar4[3].gpio.mux_total = 1;
            pmVar4[3].gpio.mux[0].pincmd = 2;
            pmVar4[3].gpio.mux[0].pin = 0xdb;
            pmVar4[3].gpio.mux[0].value = 1;
            pmVar4[3].pwm.pinmap = 0;
            pmVar4[3].pwm.parent_id = 0;
            pmVar4[3].pwm.mux_total = 0;
            pmVar4[4].name[0] = 'I';
            pmVar4[4].name[1] = 'O';
            pmVar4[4].name[2] = '4';
            pmVar4[4].name[3] = '\0';
            pmVar4[4].name[4] = '\0';
            pmVar4[4].name[5] = '\0';
            pmVar4[4].name[6] = '\0';
            pmVar4[4].name[7] = '\0';
            *(undefined1 *)&b->pins[4].capabilities = 3;
            pmVar4 = b->pins;
            pmVar4[4].gpio.pinmap = 0x81;
            pmVar4[4].gpio.parent_id = 0;
            pmVar4[4].gpio.mux_total = 1;
            pmVar4[4].gpio.mux[0].pincmd = 2;
            pmVar4[4].gpio.mux[0].pin = 0xdc;
            pmVar4[4].gpio.mux[0].value = 1;
            pmVar4[5].name[0] = 'I';
            pmVar4[5].name[1] = 'O';
            pmVar4[5].name[2] = '5';
            pmVar4[5].name[3] = '\0';
            pmVar4[5].name[4] = '\0';
            pmVar4[5].name[5] = '\0';
            pmVar4[5].name[6] = '\0';
            pmVar4[5].name[7] = '\0';
            *(undefined1 *)&b->pins[5].capabilities = 7;
            pmVar4 = b->pins;
            pmVar4[5].gpio.pinmap = 0xd;
            pmVar4[5].gpio.parent_id = 0;
            pmVar4[5].gpio.mux_total = 1;
            pmVar4[5].gpio.mux[0].pincmd = 2;
            pmVar4[5].gpio.mux[0].pin = 0xdd;
            pmVar4[5].gpio.mux[0].value = 1;
            pmVar4[5].pwm.pinmap = 1;
            pmVar4[5].pwm.parent_id = 0;
            pmVar4[5].pwm.mux_total = 0;
            pmVar4[6].name[0] = 'I';
            pmVar4[6].name[1] = 'O';
            pmVar4[6].name[2] = '6';
            pmVar4[6].name[3] = '\0';
            pmVar4[6].name[4] = '\0';
            pmVar4[6].name[5] = '\0';
            pmVar4[6].name[6] = '\0';
            pmVar4[6].name[7] = '\0';
            *(undefined1 *)&b->pins[6].capabilities = 7;
            pmVar4 = b->pins;
            pmVar4[6].gpio.pinmap = 0xb6;
            pmVar4[6].gpio.parent_id = 0;
            pmVar4[6].gpio.mux_total = 1;
            pmVar4[6].gpio.mux[0].pincmd = 2;
            pmVar4[6].gpio.mux[0].pin = 0xde;
            pmVar4[6].gpio.mux[0].value = 1;
            pmVar4[6].pwm.pinmap = 2;
            pmVar4[6].pwm.parent_id = 0;
            pmVar4[6].pwm.mux_total = 0;
            pmVar4[7].name[0] = 'I';
            pmVar4[7].name[1] = 'O';
            pmVar4[7].name[2] = '7';
            pmVar4[7].name[3] = '\0';
            pmVar4[7].name[4] = '\0';
            pmVar4[7].name[5] = '\0';
            pmVar4[7].name[6] = '\0';
            pmVar4[7].name[7] = '\0';
            *(undefined1 *)&b->pins[7].capabilities = 3;
            pmVar4 = b->pins;
            pmVar4[7].gpio.pinmap = 0x30;
            pmVar4[7].gpio.parent_id = 0;
            pmVar4[7].gpio.mux_total = 1;
            pmVar4[7].gpio.mux[0].pincmd = 2;
            pmVar4[7].gpio.mux[0].pin = 0xdf;
            pmVar4[7].gpio.mux[0].value = 1;
            pmVar4[8].name[0] = 'I';
            pmVar4[8].name[1] = 'O';
            pmVar4[8].name[2] = '8';
            pmVar4[8].name[3] = '\0';
            pmVar4[8].name[4] = '\0';
            pmVar4[8].name[5] = '\0';
            pmVar4[8].name[6] = '\0';
            pmVar4[8].name[7] = '\0';
            *(undefined1 *)&b->pins[8].capabilities = 3;
            pmVar4 = b->pins;
            pmVar4[8].gpio.pinmap = 0x31;
            pmVar4[8].gpio.parent_id = 0;
            pmVar4[8].gpio.mux_total = 1;
            pmVar4[8].gpio.mux[0].pincmd = 2;
            pmVar4[8].gpio.mux[0].pin = 0xe0;
            pmVar4[8].gpio.mux[0].value = 1;
            pmVar4[9].name[0] = 'I';
            pmVar4[9].name[1] = 'O';
            pmVar4[9].name[2] = '9';
            pmVar4[9].name[3] = '\0';
            pmVar4[9].name[4] = '\0';
            pmVar4[9].name[5] = '\0';
            pmVar4[9].name[6] = '\0';
            pmVar4[9].name[7] = '\0';
            *(undefined1 *)&b->pins[9].capabilities = 7;
            pmVar4 = b->pins;
            pmVar4[9].gpio.pinmap = 0xb7;
            pmVar4[9].gpio.parent_id = 0;
            pmVar4[9].gpio.mux_total = 1;
            pmVar4[9].gpio.mux[0].pincmd = 2;
            pmVar4[9].gpio.mux[0].pin = 0xe1;
            pmVar4[9].gpio.mux[0].value = 1;
            pmVar4[9].pwm.pinmap = 3;
            pmVar4[9].pwm.parent_id = 0;
            pmVar4[9].pwm.mux_total = 0;
            pmVar4[10].name[0] = 'I';
            pmVar4[10].name[1] = 'O';
            pmVar4[10].name[2] = '1';
            pmVar4[10].name[3] = '0';
            pmVar4[10].name[4] = '\0';
            pmVar4[10].name[5] = '\0';
            pmVar4[10].name[6] = '\0';
            pmVar4[10].name[7] = '\0';
            *(undefined1 *)&b->pins[10].capabilities = 0x13;
            pmVar4 = b->pins;
            pmVar4[10].gpio.pinmap = 0x29;
            pmVar4[10].gpio.parent_id = 0;
            pmVar4[10].gpio.mux_total = 3;
            pmVar4[10].gpio.mux[0].pincmd = 2;
            pmVar4[10].gpio.mux[0].pin = 0xe2;
            pmVar4[10].gpio.mux[0].value = 1;
            pmVar4[10].gpio.mux[1].pincmd = 4;
            pmVar4[10].gpio.mux[1].pin = 0x107;
            *(undefined8 *)&pmVar4[10].gpio.mux[1].value = 0x400000001;
            pmVar4[10].gpio.mux[2].pin = 0xf0;
            pmVar4[10].gpio.mux[2].value = 0;
            pmVar4[10].spi.pinmap = 5;
            pmVar4[10].spi.mux_total = 3;
            pmVar4[10].spi.mux[0].pincmd = 2;
            pmVar4[10].spi.mux[0].pin = 0xe2;
            pmVar4[10].spi.mux[0].value = 1;
            pmVar4[10].spi.mux[1].pincmd = 4;
            pmVar4[10].spi.mux[1].pin = 0x107;
            *(undefined8 *)&pmVar4[10].spi.mux[1].value = 0x400000001;
            pmVar4[10].spi.mux[2].pin = 0xf0;
            pmVar4[10].spi.mux[2].value = 1;
            pmVar4[0xb].name[0] = 'I';
            pmVar4[0xb].name[1] = 'O';
            pmVar4[0xb].name[2] = '1';
            pmVar4[0xb].name[3] = '1';
            pmVar4[0xb].name[4] = '\0';
            pmVar4[0xb].name[5] = '\0';
            pmVar4[0xb].name[6] = '\0';
            pmVar4[0xb].name[7] = '\0';
            *(undefined1 *)&b->pins[0xb].capabilities = 0x13;
            pmVar4 = b->pins;
            pmVar4[0xb].gpio.pinmap = 0x2b;
            pmVar4[0xb].gpio.parent_id = 0;
            pmVar4[0xb].gpio.mux_total = 3;
            pmVar4[0xb].gpio.mux[0].pincmd = 2;
            pmVar4[0xb].gpio.mux[0].pin = 0xe3;
            pmVar4[0xb].gpio.mux[0].value = 1;
            pmVar4[0xb].gpio.mux[1].pincmd = 4;
            pmVar4[0xb].gpio.mux[1].pin = 0x106;
            *(undefined8 *)&pmVar4[0xb].gpio.mux[1].value = 0x400000001;
            pmVar4[0xb].gpio.mux[2].pin = 0xf1;
            pmVar4[0xb].gpio.mux[2].value = 0;
            pmVar4[0xb].spi.pinmap = 5;
            pmVar4[0xb].spi.mux_total = 3;
            pmVar4[0xb].spi.mux[0].pincmd = 2;
            pmVar4[0xb].spi.mux[0].pin = 0xe3;
            pmVar4[0xb].spi.mux[0].value = 1;
            pmVar4[10].spi.mux[1].pincmd = 4;
            pmVar4[0xb].spi.mux[1].pin = 0x106;
            pmVar4[0xb].spi.mux[1].value = 1;
            pmVar4[10].spi.mux[2].pincmd = 4;
            pmVar4[0xb].spi.mux[2].pin = 0xf1;
            pmVar4[0xb].spi.mux[2].value = 1;
            pmVar4[0xc].name[0] = 'I';
            pmVar4[0xc].name[1] = 'O';
            pmVar4[0xc].name[2] = '1';
            pmVar4[0xc].name[3] = '2';
            pmVar4[0xc].name[4] = '\0';
            pmVar4[0xc].name[5] = '\0';
            pmVar4[0xc].name[6] = '\0';
            pmVar4[0xc].name[7] = '\0';
            *(undefined1 *)&b->pins[0xc].capabilities = 0x13;
            pmVar4 = b->pins;
            pmVar4[0xc].gpio.pinmap = 0x2a;
            pmVar4[0xc].gpio.parent_id = 0;
            pmVar4[0xc].gpio.mux_total = 2;
            pmVar4[0xc].gpio.mux[0].pincmd = 2;
            pmVar4[0xc].gpio.mux[0].pin = 0xe4;
            pmVar4[0xc].gpio.mux[0].value = 1;
            pmVar4[0xc].gpio.mux[1].pincmd = 4;
            pmVar4[0xc].gpio.mux[1].pin = 0xf2;
            pmVar4[0xc].gpio.mux[1].value = 0;
            pmVar4[0xc].spi.pinmap = 5;
            pmVar4[0xc].spi.mux_total = 2;
            pmVar4[0xc].spi.mux[0].pincmd = 2;
            pmVar4[0xc].spi.mux[0].pin = 0xe4;
            pmVar4[0xc].spi.mux[0].value = 1;
            pmVar4[0xc].spi.mux[1].pincmd = 4;
            pmVar4[0xc].spi.mux[1].pin = 0xf2;
            pmVar4[0xc].spi.mux[1].value = 1;
            pmVar4[0xd].name[0] = 'I';
            pmVar4[0xd].name[1] = 'O';
            pmVar4[0xd].name[2] = '1';
            pmVar4[0xd].name[3] = '3';
            pmVar4[0xd].name[4] = '\0';
            pmVar4[0xd].name[5] = '\0';
            pmVar4[0xd].name[6] = '\0';
            pmVar4[0xd].name[7] = '\0';
            *(undefined1 *)&b->pins[0xd].capabilities = 0x13;
            pmVar4 = b->pins;
            pmVar4[0xd].gpio.pinmap = 0x28;
            pmVar4[0xd].gpio.parent_id = 0;
            pmVar4[0xd].gpio.mux_total = 2;
            pmVar4[0xd].gpio.mux[0].pincmd = 2;
            pmVar4[0xd].gpio.mux[0].pin = 0xe5;
            pmVar4[0xd].gpio.mux[0].value = 1;
            pmVar4[0xd].gpio.mux[1].pincmd = 4;
            pmVar4[0xd].gpio.mux[1].pin = 0xf3;
            pmVar4[0xd].gpio.mux[1].value = 0;
            pmVar4[0xd].spi.pinmap = 5;
            pmVar4[0xd].spi.mux_total = 2;
            pmVar4[0xd].spi.mux[0].pincmd = 2;
            pmVar4[0xd].spi.mux[0].pin = 0xe5;
            pmVar4[0xd].spi.mux[0].value = 1;
            pmVar4[0xd].spi.mux[1].pincmd = 4;
            pmVar4[0xd].spi.mux[1].pin = 0xf3;
            pmVar4[0xd].spi.mux[1].value = 1;
            pmVar4[0xe].name[0] = 'A';
            pmVar4[0xe].name[1] = '0';
            pmVar4[0xe].name[2] = '\0';
            pmVar4[0xe].name[3] = '\0';
            pmVar4[0xe].name[4] = '\0';
            pmVar4[0xe].name[5] = '\0';
            pmVar4[0xe].name[6] = '\0';
            pmVar4[0xe].name[7] = '\0';
            *(undefined1 *)&b->pins[0xe].capabilities = 0x43;
            pmVar4 = b->pins;
            pmVar4[0xe].aio.pinmap = 0;
            pmVar4[0xe].aio.mux_total = 2;
            pmVar4[0xe].aio.mux[0].pincmd = 2;
            pmVar4[0xe].aio.mux[0].pin = 0xd0;
            pmVar4[0xe].aio.mux[0].value = 1;
            pmVar4[0xe].aio.mux[1].pincmd = 4;
            pmVar4[0xe].aio.mux[1].pin = 200;
            pmVar4[0xe].aio.mux[1].value = 1;
            pmVar4[0xe].gpio.pinmap = 0x2c;
            pmVar4[0xe].gpio.mux_total = 2;
            pmVar4[0xe].gpio.mux[0].pincmd = 2;
            pmVar4[0xe].gpio.mux[0].pin = 0xd0;
            pmVar4[0xe].gpio.mux[0].value = 1;
            pmVar4[0xe].gpio.mux[1].pincmd = 4;
            pmVar4[0xe].gpio.mux[1].pin = 200;
            pmVar4[0xe].gpio.mux[1].value = 0;
            pmVar4[0xf].name[0] = 'A';
            pmVar4[0xf].name[1] = '1';
            pmVar4[0xf].name[2] = '\0';
            pmVar4[0xf].name[3] = '\0';
            pmVar4[0xf].name[4] = '\0';
            pmVar4[0xf].name[5] = '\0';
            pmVar4[0xf].name[6] = '\0';
            pmVar4[0xf].name[7] = '\0';
            *(undefined1 *)&b->pins[0xf].capabilities = 0x43;
            pmVar4 = b->pins;
            pmVar4[0xf].aio.pinmap = 1;
            pmVar4[0xf].aio.mux_total = 2;
            pmVar4[0xf].aio.mux[0].pincmd = 2;
            pmVar4[0xf].aio.mux[0].pin = 0xd1;
            pmVar4[0xf].aio.mux[0].value = 1;
            pmVar4[0xf].aio.mux[1].pincmd = 4;
            pmVar4[0xf].aio.mux[1].pin = 0xc9;
            pmVar4[0xf].aio.mux[1].value = 1;
            pmVar4[0xf].gpio.pinmap = 0x2d;
            pmVar4[0xf].gpio.mux_total = 2;
            pmVar4[0xf].gpio.mux[0].pincmd = 2;
            pmVar4[0xf].gpio.mux[0].pin = 0xd1;
            pmVar4[0xf].gpio.mux[0].value = 1;
            pmVar4[0xf].gpio.mux[1].pincmd = 4;
            pmVar4[0xf].gpio.mux[1].pin = 0xc9;
            pmVar4[0xf].gpio.mux[1].value = 0;
            pmVar4[0x10].name[0] = 'A';
            pmVar4[0x10].name[1] = '2';
            pmVar4[0x10].name[2] = '\0';
            pmVar4[0x10].name[3] = '\0';
            pmVar4[0x10].name[4] = '\0';
            pmVar4[0x10].name[5] = '\0';
            pmVar4[0x10].name[6] = '\0';
            pmVar4[0x10].name[7] = '\0';
            *(undefined1 *)&b->pins[0x10].capabilities = 0x43;
            pmVar4 = b->pins;
            pmVar4[0x10].aio.pinmap = 2;
            pmVar4[0x10].aio.mux_total = 2;
            pmVar4[0x10].aio.mux[0].pincmd = 2;
            pmVar4[0x10].aio.mux[0].pin = 0xd2;
            pmVar4[0x10].aio.mux[0].value = 1;
            pmVar4[0x10].aio.mux[1].pincmd = 4;
            pmVar4[0x10].aio.mux[1].pin = 0xca;
            pmVar4[0x10].aio.mux[1].value = 1;
            pmVar4[0x10].gpio.pinmap = 0x2e;
            pmVar4[0x10].gpio.mux_total = 2;
            pmVar4[0x10].gpio.mux[0].pincmd = 2;
            pmVar4[0x10].gpio.mux[0].pin = 0xd2;
            pmVar4[0x10].gpio.mux[0].value = 1;
            pmVar4[0x10].gpio.mux[1].pincmd = 4;
            pmVar4[0x10].gpio.mux[1].pin = 0xca;
            pmVar4[0x10].gpio.mux[1].value = 0;
            pmVar4[0x11].name[0] = 'A';
            pmVar4[0x11].name[1] = '3';
            pmVar4[0x11].name[2] = '\0';
            pmVar4[0x11].name[3] = '\0';
            pmVar4[0x11].name[4] = '\0';
            pmVar4[0x11].name[5] = '\0';
            pmVar4[0x11].name[6] = '\0';
            pmVar4[0x11].name[7] = '\0';
            *(undefined1 *)&b->pins[0x11].capabilities = 0x43;
            pmVar4 = b->pins;
            pmVar4[0x11].aio.pinmap = 3;
            pmVar4[0x11].aio.mux_total = 2;
            pmVar4[0x11].aio.mux[0].pincmd = 2;
            pmVar4[0x11].aio.mux[0].pin = 0xd3;
            pmVar4[0x11].aio.mux[0].value = 1;
            pmVar4[0x11].aio.mux[1].pincmd = 4;
            pmVar4[0x11].aio.mux[1].pin = 0xcb;
            pmVar4[0x11].aio.mux[1].value = 1;
            pmVar4[0x11].gpio.pinmap = 0x2f;
            pmVar4[0x11].gpio.mux_total = 2;
            pmVar4[0x11].gpio.mux[0].pincmd = 2;
            pmVar4[0x11].gpio.mux[0].pin = 0xd3;
            pmVar4[0x11].gpio.mux[0].value = 1;
            pmVar4[0x11].gpio.mux[1].pincmd = 4;
            pmVar4[0x11].gpio.mux[1].pin = 0xcb;
            pmVar4[0x11].gpio.mux[1].value = 0;
            pmVar4[0x12].name[0] = 'A';
            pmVar4[0x12].name[1] = '4';
            pmVar4[0x12].name[2] = '\0';
            pmVar4[0x12].name[3] = '\0';
            pmVar4[0x12].name[4] = '\0';
            pmVar4[0x12].name[5] = '\0';
            pmVar4[0x12].name[6] = '\0';
            pmVar4[0x12].name[7] = '\0';
            *(undefined1 *)&b->pins[0x12].capabilities = 99;
            pmVar4 = b->pins;
            pmVar4[0x12].i2c.pinmap = 1;
            pmVar4[0x12].i2c.mux_total = 2;
            pmVar4[0x12].i2c.mux[0].pincmd = 2;
            pmVar4[0x12].i2c.mux[0].pin = 0xd4;
            pmVar4[0x12].i2c.mux[0].value = 1;
            pmVar4[0x12].i2c.mux[1].pincmd = 4;
            pmVar4[0x12].i2c.mux[1].pin = 0xcc;
            pmVar4[0x12].i2c.mux[1].value = 0;
            pmVar4[0x12].aio.pinmap = 4;
            pmVar4[0x12].aio.mux_total = 2;
            pmVar4[0x12].aio.mux[0].pincmd = 2;
            pmVar4[0x12].aio.mux[0].pin = 0xd4;
            pmVar4[0x12].aio.mux[0].value = 1;
            pmVar4[0x12].aio.mux[1].pincmd = 4;
            pmVar4[0x12].aio.mux[1].pin = 0xcc;
            pmVar4[0x12].aio.mux[1].value = 1;
            pmVar4[0x12].gpio.pinmap = 0xe;
            pmVar4[0x12].gpio.mux_total = 2;
            pmVar4[0x12].gpio.mux[0].pincmd = 2;
            pmVar4[0x12].gpio.mux[0].pin = 0xd4;
            pmVar4[0x12].gpio.mux[0].value = 1;
            pmVar4[0x12].gpio.mux[1].pincmd = 4;
            pmVar4[0x12].gpio.mux[1].pin = 0xcc;
            pmVar4[0x12].gpio.mux[1].value = 0;
            pmVar4[0x13].name[0] = 'A';
            pmVar4[0x13].name[1] = '5';
            pmVar4[0x13].name[2] = '\0';
            pmVar4[0x13].name[3] = '\0';
            pmVar4[0x13].name[4] = '\0';
            pmVar4[0x13].name[5] = '\0';
            pmVar4[0x13].name[6] = '\0';
            pmVar4[0x13].name[7] = '\0';
            *(undefined1 *)&b->pins[0x13].capabilities = 99;
            pmVar4 = b->pins;
            pmVar4[0x13].i2c.pinmap = 1;
            pmVar4[0x13].i2c.mux_total = 2;
            pmVar4[0x13].i2c.mux[0].pincmd = 2;
            pmVar4[0x13].i2c.mux[0].pin = 0xd5;
            pmVar4[0x13].i2c.mux[0].value = 1;
            pmVar4[0x13].i2c.mux[1].pincmd = 4;
            pmVar4[0x13].i2c.mux[1].pin = 0xcd;
            pmVar4[0x13].i2c.mux[1].value = 0;
            pmVar4[0x13].aio.pinmap = 5;
            pmVar4[0x13].aio.mux_total = 2;
            pmVar4[0x12].aio.mux[0].pincmd = 2;
            pmVar4[0x12].aio.mux[0].pin = 0xd5;
            *(undefined8 *)&pmVar4[0x12].aio.mux[0].value = 0x400000001;
            pmVar4[0x13].aio.mux[1].pin = 0xcd;
            pmVar4[0x13].aio.mux[1].value = 1;
            pmVar4[0x13].gpio.pinmap = 0xa5;
            pmVar4[0x13].gpio.mux_total = 2;
            pmVar4[0x13].gpio.mux[0].pincmd = 2;
            pmVar4[0x13].gpio.mux[0].pin = 0xd5;
            pmVar4[0x13].gpio.mux[0].value = 1;
            pmVar4[0x13].gpio.mux[1].pincmd = 4;
            pmVar4[0x13].gpio.mux[1].pin = 0xcd;
            pmVar4[0x13].gpio.mux[1].value = 0;
            b->i2c_bus_count = 9;
            b->def_i2c_bus = 6;
            for (lVar5 = 0x20; lVar5 != 0xf8; lVar5 = lVar5 + 0x18) {
              *(undefined4 *)((long)&((mraa_board_t *)(b->i2c_bus + -1))->phy_pin_count + lVar5) =
                   0xffffffff;
            }
            b->i2c_bus[6].bus_id = 6;
            b->i2c_bus[6].scl = 0x13;
            b->i2c_bus[6].sda = 0x12;
            b->spi_bus_count = 1;
            b->def_spi_bus = 0;
            b->spi_bus[0].bus_id = 5;
            b->spi_bus[0].slave_s = 1;
            b->spi_bus[0].sclk = 0xd;
            b->spi_bus[0].mosi = 0xb;
            b->spi_bus[0].miso = 0xc;
            b->spi_bus[0].cs = 10;
            b->uart_dev_count = 1;
            b->def_uart_dev = 0;
            b->uart_dev[0].rx = 0;
            b->uart_dev[0].tx = 1;
            pcVar6 = "/dev/ttyMFD1";
            if (vanilla_kernel != '\0') {
              pcVar6 = "/dev/ttyS1";
            }
            b->uart_dev[0].device_path = pcVar6;
            for (lVar5 = 0; lVar5 != 1000; lVar5 = lVar5 + 0x28) {
              *(undefined4 *)((long)&pinmodes[0].i2c.sysfs + lVar5) = 0xffffffff;
              *(undefined4 *)((long)&pinmodes[0].i2c.mode + lVar5) = 0xffffffff;
              *(undefined4 *)((long)&pinmodes[0].spi.sysfs + lVar5) = 0xffffffff;
              *(undefined4 *)((long)&pinmodes[0].spi.mode + lVar5) = 0xffffffff;
              *(undefined4 *)((long)&pinmodes[0].gpio.sysfs + lVar5) = 0xffffffff;
              *(undefined4 *)((long)&pinmodes[0].gpio.mode + lVar5) = 0xffffffff;
              *(undefined4 *)((long)&pinmodes[0].pwm.sysfs + lVar5) = 0xffffffff;
              *(undefined4 *)((long)&pinmodes[0].pwm.mode + lVar5) = 0xffffffff;
              *(undefined8 *)((long)&pinmodes[0].uart.sysfs + lVar5) = 0xffffffffffffffff;
            }
            pinmodes[0].gpio.sysfs = 0x82;
            pinmodes[0].gpio.mode = 0;
            pinmodes[0].uart.sysfs = 0x82;
            pinmodes[0].uart.mode = 1;
            pinmodes[1].gpio.sysfs = 0x83;
            pinmodes[1].gpio.mode = 0;
            pinmodes[1].uart.sysfs = 0x83;
            pinmodes[1].uart.mode = 1;
            pinmodes[2].gpio.sysfs = 0x80;
            pinmodes[2].gpio.mode = 0;
            pinmodes[2].uart.sysfs = 0x80;
            pinmodes[2].uart.mode = 1;
            pinmodes[3].gpio.sysfs = 0xc;
            pinmodes[3].gpio.mode = 0;
            pinmodes[3].pwm.sysfs = 0xc;
            pinmodes[3].pwm.mode = 1;
            pinmodes[4].gpio.sysfs = 0x81;
            pinmodes[4].gpio.mode = 0;
            pinmodes[4].uart.sysfs = 0x81;
            pinmodes[4].uart.mode = 1;
            pinmodes[5].gpio.sysfs = 0xd;
            pinmodes[5].gpio.mode = 0;
            pinmodes[5].pwm.sysfs = 0xd;
            pinmodes[5].pwm.mode = 1;
            pinmodes[6].gpio.sysfs = 0xb6;
            pinmodes[6].gpio.mode = 0;
            pinmodes[6].pwm.sysfs = 0xb6;
            pinmodes[6].pwm.mode = 1;
            pinmodes[9].gpio.sysfs = 0xb7;
            pinmodes[9].gpio.mode = 0;
            pinmodes[9].pwm.sysfs = 0xb7;
            pinmodes[9].pwm.mode = 1;
            pinmodes[10].gpio.sysfs = 0x29;
            pinmodes[10].gpio.mode = 0;
            pinmodes[10].spi.sysfs = 0x6f;
            pinmodes[10].spi.mode = 1;
            pinmodes[0xb].gpio.sysfs = 0x2b;
            pinmodes[0xb].gpio.mode = 0;
            pinmodes[0xb].spi.sysfs = 0x73;
            pinmodes[0xb].spi.mode = 1;
            pinmodes[0xc].gpio.sysfs = 0x2a;
            pinmodes[0xc].gpio.mode = 0;
            pinmodes[0xc].spi.sysfs = 0x72;
            pinmodes[0xc].spi.mode = 1;
            pinmodes[0xd].gpio.sysfs = 0x28;
            pinmodes[0xd].gpio.mode = 0;
            pinmodes[0xd].spi.sysfs = 0x6d;
            pinmodes[0xd].spi.mode = 1;
            pinmodes[0x12].gpio.sysfs = 0xe;
            pinmodes[0x12].gpio.mode = 0;
            pinmodes[0x12].i2c.sysfs = 0x1c;
            pinmodes[0x12].i2c.mode = 1;
            pinmodes[0x13].gpio.sysfs = 0xa5;
            pinmodes[0x13].gpio.mode = 0;
            pinmodes[0x13].i2c.sysfs = 0x1b;
            pinmodes[0x13].i2c.mode = 1;
            return b;
          }
          free(b->pins);
          __ptr = b->adv_func;
        }
        free(__ptr);
      }
    }
  }
LAB_00117b49:
  syslog(2,"edison: Arduino board failed to initialise");
  free(b);
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t*
mraa_intel_edison_fab_c()
{
    mraa_gpio_dir_t tristate_dir;
    struct utsname name;
    int major, minor, release;
    int ret;
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof(mraa_board_t));
    if (b == NULL) {
        return NULL;
    }

    b->platform_name = PLATFORM_NAME;

    if (uname(&name) != 0) {
        goto error;
    }

    ret = sscanf(name.release, "%d.%d.%d", &major, &minor, &release);
    if (ret == 2) {
        ret++;
        release = 0;
    }
    if (ret < 2) {
        goto error;
    }

    if (major >= 4) {
        vanilla_kernel = 1;
        syslog(LOG_NOTICE,
               "edison: Linux version 4 or higher detected, assuming Vanilla kernel");
    };

    if (is_arduino_board() == 0) {
        syslog(LOG_NOTICE,
               "edison: Arduino board not detected, assuming Intel Edison Miniboard");
        if (mraa_intel_edison_miniboard(b) != MRAA_SUCCESS) {
            goto error;
        }
        return b;
    }
    // Now Assuming the edison is attached to the Arduino board.
    b->phy_pin_count = 20;
    b->gpio_count = 14;
    b->aio_count = 6;
    b->platform_version = "arduino";

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        goto error;
    }
    b->adv_func->gpio_dir_pre = &mraa_intel_edison_gpio_dir_pre;
    b->adv_func->gpio_init_post = &mraa_intel_edison_gpio_init_post;
    b->adv_func->gpio_close_pre = &mraa_intel_edison_gpio_close_pre;
    b->adv_func->gpio_dir_post = &mraa_intel_edison_gpio_dir_post;
    b->adv_func->i2c_init_pre = &mraa_intel_edison_i2c_init_pre;
    b->adv_func->i2c_set_frequency_replace = &mraa_intel_edison_i2c_freq;
    b->adv_func->aio_get_valid_fp = &mraa_intel_edison_aio_get_fp;
    b->adv_func->aio_init_pre = &mraa_intel_edison_aio_init_pre;
    b->adv_func->aio_init_post = &mraa_intel_edison_aio_init_post;
    b->adv_func->pwm_init_pre = &mraa_intel_edison_pwm_init_pre;
    b->adv_func->pwm_init_post = &mraa_intel_edison_pwm_init_post;
    b->adv_func->pwm_enable_pre = &mraa_intel_edison_pwm_enable_pre;
    b->adv_func->pwm_write_pre = &mraa_intel_edison_pwm_write_pre;
    b->adv_func->spi_init_pre = &mraa_intel_edison_spi_init_pre;
    b->adv_func->spi_init_post = &mraa_intel_edison_spi_init_post;
    b->adv_func->gpio_mode_replace = &mraa_intel_edison_gpio_mode_replace;
    b->adv_func->uart_init_pre = &mraa_intel_edison_uart_init_pre;
    b->adv_func->uart_init_post = &mraa_intel_edison_uart_init_post;
    b->adv_func->gpio_mmap_setup = &mraa_intel_edison_mmap_setup;
    b->adv_func->spi_lsbmode_replace = &mraa_intel_edison_spi_lsbmode_replace;

    b->pins = (mraa_pininfo_t*) calloc(MRAA_INTEL_EDISON_PINCOUNT, sizeof(mraa_pininfo_t));
    if (b->pins == NULL) {
        free(b->adv_func);
        goto error;
    }

    if (mraa_gpio_read_dir(tristate, &tristate_dir) != MRAA_SUCCESS) {
        free(b->pins);
        free(b->adv_func);
        goto error;
    }

    if (tristate_dir != MRAA_GPIO_OUT) {
        mraa_gpio_dir(tristate, MRAA_GPIO_OUT);
    }

    // this is required to initialise not just SPI but also the ADC channels
    mraa_intel_edison_misc_spi();

    b->adc_raw = 12;
    b->adc_supported = 10;
    b->pwm_default_period = 5000;
    b->pwm_max_period = 218453;
    b->pwm_min_period = 1;

    strncpy(b->pins[0].name, "IO0", 8);
    b->pins[0].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 1 };
    b->pins[0].gpio.pinmap = 130;
    b->pins[0].gpio.parent_id = 0;
    b->pins[0].gpio.mux_total = 1;
    b->pins[0].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[0].gpio.mux[0].pin = 216;
    b->pins[0].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[0].uart.pinmap = 0;
    b->pins[0].uart.parent_id = 0;
    b->pins[0].uart.mux_total = 0;

    strncpy(b->pins[1].name, "IO1", 8);
    b->pins[1].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 1 };
    b->pins[1].gpio.pinmap = 131;
    b->pins[1].gpio.parent_id = 0;
    b->pins[1].gpio.mux_total = 1;
    b->pins[1].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[1].gpio.mux[0].pin = 217;
    b->pins[1].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[1].uart.pinmap = 0;
    b->pins[1].uart.parent_id = 0;
    b->pins[1].uart.mux_total = 0;

    strncpy(b->pins[2].name, "IO2", 8);
    b->pins[2].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[2].gpio.pinmap = 128;
    b->pins[2].gpio.parent_id = 0;
    b->pins[2].gpio.mux_total = 1;
    b->pins[2].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[2].gpio.mux[0].pin = 218;
    b->pins[2].gpio.mux[0].value = MRAA_GPIO_IN;

    strncpy(b->pins[3].name, "IO3", 8);
    b->pins[3].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[3].gpio.pinmap = 12;
    b->pins[3].gpio.parent_id = 0;
    b->pins[3].gpio.mux_total = 1;
    b->pins[3].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[3].gpio.mux[0].pin = 219;
    b->pins[3].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[3].pwm.pinmap = 0;
    b->pins[3].pwm.parent_id = 0;
    b->pins[3].pwm.mux_total = 0;

    strncpy(b->pins[4].name, "IO4", 8);
    b->pins[4].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[4].gpio.pinmap = 129;
    b->pins[4].gpio.parent_id = 0;
    b->pins[4].gpio.mux_total = 1;
    b->pins[4].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[4].gpio.mux[0].pin = 220;
    b->pins[4].gpio.mux[0].value = MRAA_GPIO_IN;

    strncpy(b->pins[5].name, "IO5", 8);
    b->pins[5].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[5].gpio.pinmap = 13;
    b->pins[5].gpio.parent_id = 0;
    b->pins[5].gpio.mux_total = 1;
    b->pins[5].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[5].gpio.mux[0].pin = 221;
    b->pins[5].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[5].pwm.pinmap = 1;
    b->pins[5].pwm.parent_id = 0;
    b->pins[5].pwm.mux_total = 0;

    strncpy(b->pins[6].name, "IO6", 8);
    b->pins[6].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[6].gpio.pinmap = 182;
    b->pins[6].gpio.parent_id = 0;
    b->pins[6].gpio.mux_total = 1;
    b->pins[6].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[6].gpio.mux[0].pin = 222;
    b->pins[6].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[6].pwm.pinmap = 2;
    b->pins[6].pwm.parent_id = 0;
    b->pins[6].pwm.mux_total = 0;

    strncpy(b->pins[7].name, "IO7", 8);
    b->pins[7].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[7].gpio.pinmap = 48;
    b->pins[7].gpio.parent_id = 0;
    b->pins[7].gpio.mux_total = 1;
    b->pins[7].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[7].gpio.mux[0].pin = 223;
    b->pins[7].gpio.mux[0].value = MRAA_GPIO_IN;

    strncpy(b->pins[8].name, "IO8", 8);
    b->pins[8].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[8].gpio.pinmap = 49;
    b->pins[8].gpio.parent_id = 0;
    b->pins[8].gpio.mux_total = 1;
    b->pins[8].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[8].gpio.mux[0].pin = 224;
    b->pins[8].gpio.mux[0].value = MRAA_GPIO_IN;

    strncpy(b->pins[9].name, "IO9", 8);
    b->pins[9].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[9].gpio.pinmap = 183;
    b->pins[9].gpio.parent_id = 0;
    b->pins[9].gpio.mux_total = 1;
    b->pins[9].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[9].gpio.mux[0].pin = 225;
    b->pins[9].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[9].pwm.pinmap = 3;
    b->pins[9].pwm.parent_id = 0;
    b->pins[9].pwm.mux_total = 0;

    strncpy(b->pins[10].name, "IO10", 8);
    b->pins[10].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[10].gpio.pinmap = 41;
    b->pins[10].gpio.parent_id = 0;
    b->pins[10].gpio.mux_total = 3;
    b->pins[10].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[10].gpio.mux[0].pin = 226;
    b->pins[10].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[10].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[10].gpio.mux[1].pin = 263;
    b->pins[10].gpio.mux[1].value = 1;
    b->pins[10].gpio.mux[2].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[10].gpio.mux[2].pin = 240;
    b->pins[10].gpio.mux[2].value = 0;
    b->pins[10].spi.pinmap = 5;
    b->pins[10].spi.mux_total = 3;
    b->pins[10].spi.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[10].spi.mux[0].pin = 226;
    b->pins[10].spi.mux[0].value = MRAA_GPIO_IN;
    b->pins[10].spi.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[10].spi.mux[1].pin = 263;
    b->pins[10].spi.mux[1].value = 1;
    b->pins[10].spi.mux[2].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[10].spi.mux[2].pin = 240;
    b->pins[10].spi.mux[2].value = 1;

    strncpy(b->pins[11].name, "IO11", 8);
    b->pins[11].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[11].gpio.pinmap = 43;
    b->pins[11].gpio.parent_id = 0;
    b->pins[11].gpio.mux_total = 3;
    b->pins[11].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[11].gpio.mux[0].pin = 227;
    b->pins[11].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[11].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[11].gpio.mux[1].pin = 262;
    b->pins[11].gpio.mux[1].value = 1;
    b->pins[11].gpio.mux[2].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[11].gpio.mux[2].pin = 241;
    b->pins[11].gpio.mux[2].value = 0;
    b->pins[11].spi.pinmap = 5;
    b->pins[11].spi.mux_total = 3;
    b->pins[11].spi.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[11].spi.mux[0].pin = 227;
    b->pins[11].spi.mux[0].value = MRAA_GPIO_IN;
    b->pins[10].spi.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[11].spi.mux[1].pin = 262;
    b->pins[11].spi.mux[1].value = 1;
    b->pins[10].spi.mux[2].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[11].spi.mux[2].pin = 241;
    b->pins[11].spi.mux[2].value = 1;

    strncpy(b->pins[12].name, "IO12", 8);
    b->pins[12].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[12].gpio.pinmap = 42;
    b->pins[12].gpio.parent_id = 0;
    b->pins[12].gpio.mux_total = 2;
    b->pins[12].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[12].gpio.mux[0].pin = 228;
    b->pins[12].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[12].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[12].gpio.mux[1].pin = 242;
    b->pins[12].gpio.mux[1].value = 0;
    b->pins[12].spi.pinmap = 5;
    b->pins[12].spi.mux_total = 2;
    b->pins[12].spi.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[12].spi.mux[0].pin = 228;
    b->pins[12].spi.mux[0].value = MRAA_GPIO_IN;
    b->pins[12].spi.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[12].spi.mux[1].pin = 242;
    b->pins[12].spi.mux[1].value = 1;

    strncpy(b->pins[13].name, "IO13", 8);
    b->pins[13].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[13].gpio.pinmap = 40;
    b->pins[13].gpio.parent_id = 0;
    b->pins[13].gpio.mux_total = 2;
    b->pins[13].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[13].gpio.mux[0].pin = 229;
    b->pins[13].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[13].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[13].gpio.mux[1].pin = 243;
    b->pins[13].gpio.mux[1].value = 0;
    b->pins[13].spi.pinmap = 5;
    b->pins[13].spi.mux_total = 2;
    b->pins[13].spi.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[13].spi.mux[0].pin = 229;
    b->pins[13].spi.mux[0].value = MRAA_GPIO_IN;
    b->pins[13].spi.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[13].spi.mux[1].pin = 243;
    b->pins[13].spi.mux[1].value = 1;

    strncpy(b->pins[14].name, "A0", 8);
    b->pins[14].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[14].aio.pinmap = 0;
    b->pins[14].aio.mux_total = 2;
    b->pins[14].aio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[14].aio.mux[0].pin = 208;
    b->pins[14].aio.mux[0].value = MRAA_GPIO_IN;
    b->pins[14].aio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[14].aio.mux[1].pin = 200;
    b->pins[14].aio.mux[1].value = 1;
    b->pins[14].gpio.pinmap = 44;
    b->pins[14].gpio.mux_total = 2;
    b->pins[14].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[14].gpio.mux[0].pin = 208;
    b->pins[14].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[14].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[14].gpio.mux[1].pin = 200;
    b->pins[14].gpio.mux[1].value = 0;

    strncpy(b->pins[15].name, "A1", 8);
    b->pins[15].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[15].aio.pinmap = 1;
    b->pins[15].aio.mux_total = 2;
    b->pins[15].aio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[15].aio.mux[0].pin = 209;
    b->pins[15].aio.mux[0].value = MRAA_GPIO_IN;
    b->pins[15].aio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[15].aio.mux[1].pin = 201;
    b->pins[15].aio.mux[1].value = 1;
    b->pins[15].gpio.pinmap = 45;
    b->pins[15].gpio.mux_total = 2;
    b->pins[15].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[15].gpio.mux[0].pin = 209;
    b->pins[15].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[15].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[15].gpio.mux[1].pin = 201;
    b->pins[15].gpio.mux[1].value = 0;

    strncpy(b->pins[16].name, "A2", 8);
    b->pins[16].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[16].aio.pinmap = 2;
    b->pins[16].aio.mux_total = 2;
    b->pins[16].aio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[16].aio.mux[0].pin = 210;
    b->pins[16].aio.mux[0].value = MRAA_GPIO_IN;
    b->pins[16].aio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[16].aio.mux[1].pin = 202;
    b->pins[16].aio.mux[1].value = 1;
    b->pins[16].gpio.pinmap = 46;
    b->pins[16].gpio.mux_total = 2;
    b->pins[16].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[16].gpio.mux[0].pin = 210;
    b->pins[16].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[16].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[16].gpio.mux[1].pin = 202;
    b->pins[16].gpio.mux[1].value = 0;

    strncpy(b->pins[17].name, "A3", 8);
    b->pins[17].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[17].aio.pinmap = 3;
    b->pins[17].aio.mux_total = 2;
    b->pins[17].aio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[17].aio.mux[0].pin = 211;
    b->pins[17].aio.mux[0].value = MRAA_GPIO_IN;
    b->pins[17].aio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[17].aio.mux[1].pin = 203;
    b->pins[17].aio.mux[1].value = 1;
    b->pins[17].gpio.pinmap = 47;
    b->pins[17].gpio.mux_total = 2;
    b->pins[17].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[17].gpio.mux[0].pin = 211;
    b->pins[17].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[17].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[17].gpio.mux[1].pin = 203;
    b->pins[17].gpio.mux[1].value = 0;

    strncpy(b->pins[18].name, "A4", 8);
    b->pins[18].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 1, 1, 0 };
    b->pins[18].i2c.pinmap = 1;
    b->pins[18].i2c.mux_total = 2;
    b->pins[18].i2c.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[18].i2c.mux[0].pin = 212;
    b->pins[18].i2c.mux[0].value = MRAA_GPIO_IN;
    b->pins[18].i2c.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[18].i2c.mux[1].pin = 204;
    b->pins[18].i2c.mux[1].value = 0;
    b->pins[18].aio.pinmap = 4;
    b->pins[18].aio.mux_total = 2;
    b->pins[18].aio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[18].aio.mux[0].pin = 212;
    b->pins[18].aio.mux[0].value = MRAA_GPIO_IN;
    b->pins[18].aio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[18].aio.mux[1].pin = 204;
    b->pins[18].aio.mux[1].value = 1;
    b->pins[18].gpio.pinmap = 14;
    b->pins[18].gpio.mux_total = 2;
    b->pins[18].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[18].gpio.mux[0].pin = 212;
    b->pins[18].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[18].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[18].gpio.mux[1].pin = 204;
    b->pins[18].gpio.mux[1].value = 0;

    strncpy(b->pins[19].name, "A5", 8);
    b->pins[19].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 1, 1, 0 };
    b->pins[19].i2c.pinmap = 1;
    b->pins[19].i2c.mux_total = 2;
    b->pins[19].i2c.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[19].i2c.mux[0].pin = 213;
    b->pins[19].i2c.mux[0].value = MRAA_GPIO_IN;
    b->pins[19].i2c.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[19].i2c.mux[1].pin = 205;
    b->pins[19].i2c.mux[1].value = 0;
    b->pins[19].aio.pinmap = 5;
    b->pins[19].aio.mux_total = 2;
    b->pins[18].aio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[18].aio.mux[0].pin = 213;
    b->pins[18].aio.mux[0].value = MRAA_GPIO_IN;
    b->pins[18].aio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[19].aio.mux[1].pin = 205;
    b->pins[19].aio.mux[1].value = 1;
    b->pins[19].gpio.pinmap = 165;
    b->pins[19].gpio.mux_total = 2;
    b->pins[19].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[19].gpio.mux[0].pin = 213;
    b->pins[19].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[19].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[19].gpio.mux[1].pin = 205;
    b->pins[19].gpio.mux[1].value = 0;

    // BUS DEFINITIONS
    b->i2c_bus_count = 9;
    b->def_i2c_bus = 6;
    int ici;
    for (ici = 0; ici < 9; ici++) {
        b->i2c_bus[ici].bus_id = -1;
    }
    b->i2c_bus[6].bus_id = 6;
    b->i2c_bus[6].sda = 18;
    b->i2c_bus[6].scl = 19;

    b->spi_bus_count = 1;
    b->def_spi_bus = 0;
    b->spi_bus[0].bus_id = 5;
    b->spi_bus[0].slave_s = 1;
    b->spi_bus[0].cs = 10;
    b->spi_bus[0].mosi = 11;
    b->spi_bus[0].miso = 12;
    b->spi_bus[0].sclk = 13;

    b->uart_dev_count = 1;
    b->def_uart_dev = 0;
    b->uart_dev[0].rx = 0;
    b->uart_dev[0].tx = 1;
    b->uart_dev[0].device_path = UART_DEV_PATH;

    int il;
    for (il = 0; il < MRAA_INTEL_EDISON_PINCOUNT; il++) {
        pinmodes[il].gpio.sysfs = -1;
        pinmodes[il].gpio.mode = -1;
        pinmodes[il].pwm.sysfs = -1;
        pinmodes[il].pwm.mode = -1;
        pinmodes[il].i2c.sysfs = -1;
        pinmodes[il].i2c.mode = -1;
        pinmodes[il].spi.sysfs = -1;
        pinmodes[il].spi.mode = -1;
        pinmodes[il].uart.sysfs = -1;
        pinmodes[il].uart.mode = -1;
    }
    pinmodes[0].gpio.sysfs = 130;
    pinmodes[0].gpio.mode = 0;
    pinmodes[0].uart.sysfs = 130;
    pinmodes[0].uart.mode = 1;
    pinmodes[1].gpio.sysfs = 131;
    pinmodes[1].gpio.mode = 0;
    pinmodes[1].uart.sysfs = 131;
    pinmodes[1].uart.mode = 1;
    pinmodes[2].gpio.sysfs = 128;
    pinmodes[2].gpio.mode = 0;
    pinmodes[2].uart.sysfs = 128;
    pinmodes[2].uart.mode = 1;
    pinmodes[3].gpio.sysfs = 12;
    pinmodes[3].gpio.mode = 0;
    pinmodes[3].pwm.sysfs = 12;
    pinmodes[3].pwm.mode = 1;

    pinmodes[4].gpio.sysfs = 129;
    pinmodes[4].gpio.mode = 0;
    pinmodes[4].uart.sysfs = 129;
    pinmodes[4].uart.mode = 1;
    pinmodes[5].gpio.sysfs = 13;
    pinmodes[5].gpio.mode = 0;
    pinmodes[5].pwm.sysfs = 13;
    pinmodes[5].pwm.mode = 1;
    pinmodes[6].gpio.sysfs = 182;
    pinmodes[6].gpio.mode = 0;
    pinmodes[6].pwm.sysfs = 182;
    pinmodes[6].pwm.mode = 1;

    // 7 and 8 are provided by something on i2c, very simple

    pinmodes[9].gpio.sysfs = 183;
    pinmodes[9].gpio.mode = 0;
    pinmodes[9].pwm.sysfs = 183;
    pinmodes[9].pwm.mode = 1;

    pinmodes[10].gpio.sysfs = 41;
    pinmodes[10].gpio.mode = 0;
    pinmodes[10].spi.sysfs = 111; // Different pin provides, switched at mux level.
    pinmodes[10].spi.mode = 1;

    pinmodes[11].gpio.sysfs = 43;
    pinmodes[11].gpio.mode = 0;
    pinmodes[11].spi.sysfs = 115; // Different pin provides, switched at mux level.
    pinmodes[11].spi.mode = 1;

    pinmodes[12].gpio.sysfs = 42;
    pinmodes[12].gpio.mode = 0;
    pinmodes[12].spi.sysfs = 114; // Different pin provides, switched at mux level.
    pinmodes[12].spi.mode = 1;

    pinmodes[13].gpio.sysfs = 40;
    pinmodes[13].gpio.mode = 0;
    pinmodes[13].spi.sysfs = 109; // Different pin provides, switched at mux level.
    pinmodes[13].spi.mode = 1;

    // Everything else but A4 A5 LEAVE

    pinmodes[18].gpio.sysfs = 14;
    pinmodes[18].gpio.mode = 0;
    pinmodes[18].i2c.sysfs = 28;
    pinmodes[18].i2c.mode = 1;

    pinmodes[19].gpio.sysfs = 165;
    pinmodes[19].gpio.mode = 0;
    pinmodes[19].i2c.sysfs = 27;
    pinmodes[19].i2c.mode = 1;

    return b;
error:
    syslog(LOG_CRIT, "edison: Arduino board failed to initialise");
    free(b);
    return NULL;
}